

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  FieldDescriptor field_type;
  uint uVar1;
  int number;
  bool packed;
  CppType CVar2;
  uint32 uVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  void *pvVar6;
  LogFinisher local_71;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if (*(int *)(field + 0x3c) != 3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x892);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_70 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,&local_70)
    ;
  }
  CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
  if (CVar2 != cpp_type) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_70);
      CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    }
    if ((cpp_type != CPPTYPE_INT32) || (CVar2 != CPPTYPE_ENUM)) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x895);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32): "
                         );
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,"The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,"the actual field type (for enums T should be the generated enum ")
      ;
      pLVar4 = internal::LogMessage::operator<<(pLVar4,"type or int32).");
      internal::LogFinisher::operator=(&local_71,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  if (message_type != (Descriptor *)0x0) {
    pDVar5 = FieldDescriptor::message_type(field);
    if (pDVar5 != message_type) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x89a);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (message_type) == (field->message_type()): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_70);
    }
    field_type = field[0x38];
    packed = FieldDescriptor::is_packed(field);
    pvVar6 = internal::ExtensionSet::MutableRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                        number,(FieldType)field_type,packed,field);
  }
  else {
    uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    pvVar6 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  }
  return pvVar6;
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != nullptr) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}